

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

bool __thiscall Map::Occupied(Map *this,uchar x,uchar y,OccupiedTarget target,bool adminghost)

{
  _List_node_base *p_Var1;
  NPC *pNVar2;
  pointer ppNVar3;
  _List_node_base *p_Var4;
  byte bVar5;
  
  if ((x < this->width) && (y < this->height)) {
    if (target != NPCOnly) {
      for (p_Var4 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next;
          p_Var4 != (_List_node_base *)&this->characters; p_Var4 = p_Var4->_M_next) {
        p_Var1 = p_Var4[1]._M_next;
        if (adminghost) {
          bVar5 = 1;
          if ((*(byte *)((long)(p_Var1 + 0xf) + 4) & 4) == 0) {
            bVar5 = (*(byte *)&p_Var1[0xf]._M_next & 4) >> 2;
          }
        }
        else {
          bVar5 = 0;
        }
        if ((*(uchar *)&p_Var1[0xc]._M_next == x) &&
           ((~bVar5 & *(uchar *)((long)(p_Var1 + 0xc) + 1) == y) != 0)) {
          return true;
        }
      }
      if (target == PlayerOnly) {
        return false;
      }
    }
    for (ppNVar3 = (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppNVar3 !=
        (this->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppNVar3 = ppNVar3 + 1) {
      pNVar2 = *ppNVar3;
      if (((pNVar2->alive == true) && (pNVar2->x == x)) && (pNVar2->y == y)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool Map::Occupied(unsigned char x, unsigned char y, Map::OccupiedTarget target, bool adminghost) const
{
	if (!InBounds(x, y))
	{
		return false;
	}

	if (target != Map::NPCOnly)
	{
		UTIL_FOREACH(this->characters, character)
		{
			bool ghost = adminghost && (!character->CanInteractCombat() || character->IsHideNpc());

			if (character->x == x && character->y == y && !ghost)
			{
				return true;
			}
		}
	}

	if (target != Map::PlayerOnly)
	{
		UTIL_FOREACH(this->npcs, npc)
		{
			if (npc->alive && npc->x == x && npc->y == y)
			{
				return true;
			}
		}
	}

	return false;
}